

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraBmc.c
# Opt level: O2

Aig_Man_t * Fra_BmcFrames(Fra_Bmc_t *p,int fKeepPos)

{
  long lVar1;
  Aig_Obj_t *pAVar2;
  long lVar3;
  Aig_Man_t *p_00;
  char *pcVar4;
  void *pvVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  void *pvVar8;
  long lVar9;
  Aig_Man_t *pAVar10;
  int iVar11;
  int i;
  int iVar12;
  Aig_Obj_t *pAVar13;
  int iVar14;
  int iVar15;
  
  p_00 = Aig_ManStart(p->nFramesAll * p->pAig->vObjs->nSize);
  pcVar4 = Abc_UtilStrsav(p->pAig->pName);
  p_00->pName = pcVar4;
  pcVar4 = Abc_UtilStrsav(p->pAig->pSpec);
  p_00->pSpec = pcVar4;
  iVar11 = p->nFramesAll;
  lVar9 = 0;
  iVar14 = 0;
  if (0 < iVar11) {
    iVar14 = iVar11;
  }
  for (; iVar14 != (int)lVar9; lVar9 = lVar9 + 1) {
    pAVar6 = p->pAig->pConst1;
    lVar1 = *(long *)((long)(pAVar6->field_5).pData + 0x40);
    *(Aig_Obj_t **)
     (*(long *)(lVar1 + 0x30) + ((long)pAVar6->Id * (long)*(int *)(lVar1 + 8) + lVar9) * 8) =
         p_00->pConst1;
  }
  for (iVar14 = 0; iVar14 < iVar11; iVar14 = iVar14 + 1) {
    for (iVar11 = 0; pAVar10 = p->pAig, iVar11 < pAVar10->nObjs[2] - pAVar10->nRegs;
        iVar11 = iVar11 + 1) {
      pvVar5 = Vec_PtrEntry(pAVar10->vCis,iVar11);
      pAVar6 = Aig_ObjCreateCi(p_00);
      lVar9 = *(long *)(*(long *)((long)pvVar5 + 0x28) + 0x40);
      *(Aig_Obj_t **)
       (*(long *)(lVar9 + 0x30) +
       (long)(*(int *)((long)pvVar5 + 0x24) * *(int *)(lVar9 + 8) + iVar14) * 8) = pAVar6;
    }
    iVar11 = p->nFramesAll;
  }
  pAVar10 = p->pAig;
  iVar11 = pAVar10->nObjs[2] - pAVar10->nRegs;
  while( true ) {
    if (pAVar10->vCis->nSize <= iVar11) break;
    pvVar5 = Vec_PtrEntry(pAVar10->vCis,iVar11);
    lVar9 = *(long *)(*(long *)((long)pvVar5 + 0x28) + 0x40);
    *(ulong *)(*(long *)(lVar9 + 0x30) +
              (long)*(int *)((long)pvVar5 + 0x24) * (long)*(int *)(lVar9 + 8) * 8) =
         (ulong)p_00->pConst1 ^ 1;
    iVar11 = iVar11 + 1;
    pAVar10 = p->pAig;
  }
  pvVar5 = malloc((long)pAVar10->nRegs << 3);
  iVar11 = 0;
  while (iVar14 = p->nFramesAll, iVar11 < iVar14) {
    for (iVar14 = 0; iVar14 < pAVar10->vObjs->nSize; iVar14 = iVar14 + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAVar10->vObjs,iVar14);
      if ((pAVar6 != (Aig_Obj_t *)0x0) && (0xfffffffd < (*(uint *)&pAVar6->field_0x18 & 7) - 7)) {
        pAVar7 = Bmc_ObjChild0Frames(pAVar6,iVar11);
        if (((ulong)pAVar6 & 1) != 0) {
          __assert_fail("!Aig_IsComplement(pObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                        ,0x37,"Aig_Obj_t *Bmc_ObjChild1Frames(Aig_Obj_t *, int)");
        }
        pAVar2 = pAVar6->pFanin1;
        pAVar13 = (Aig_Obj_t *)((ulong)pAVar2 & 0xfffffffffffffffe);
        if (pAVar13 == (Aig_Obj_t *)0x0) {
          pAVar13 = (Aig_Obj_t *)0x0;
        }
        else {
          pAVar13 = Bmc_ObjFrames(pAVar13,iVar11);
          pAVar13 = (Aig_Obj_t *)((ulong)((uint)pAVar2 & 1) ^ (ulong)pAVar13);
        }
        pAVar7 = Aig_And(p_00,pAVar7,pAVar13);
        lVar9 = *(long *)((long)(pAVar6->field_5).pData + 0x40);
        *(Aig_Obj_t **)
         (*(long *)(lVar9 + 0x30) + (long)(pAVar6->Id * *(int *)(lVar9 + 8) + iVar11) * 8) = pAVar7;
      }
      pAVar10 = p->pAig;
    }
    iVar14 = p->nFramesAll;
    if (iVar11 == iVar14 + -1) break;
    iVar14 = pAVar10->nObjs[3];
    iVar12 = pAVar10->nRegs;
    iVar15 = 0;
    lVar9 = 0;
    while( true ) {
      i = (iVar14 - iVar12) + (int)lVar9;
      if (pAVar10->vCos->nSize <= i) break;
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAVar10->vCos,i);
      pAVar6 = Bmc_ObjChild0Frames(pAVar6,iVar11);
      *(Aig_Obj_t **)((long)pvVar5 + lVar9 * 8) = pAVar6;
      lVar9 = lVar9 + 1;
      pAVar10 = p->pAig;
      iVar15 = iVar15 + -1;
    }
    if (pAVar10->nRegs != (int)lVar9) {
      __assert_fail("k == Aig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                    ,0x112,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
    }
    iVar11 = iVar11 + 1;
    iVar14 = pAVar10->nObjs[2];
    lVar9 = 0;
    while( true ) {
      iVar12 = iVar15 + iVar14 + (int)lVar9;
      if (pAVar10->vCis->nSize <= iVar12) break;
      pvVar8 = Vec_PtrEntry(pAVar10->vCis,iVar12);
      lVar1 = lVar9 * 8;
      lVar9 = lVar9 + 1;
      lVar3 = *(long *)(*(long *)((long)pvVar8 + 0x28) + 0x40);
      *(undefined8 *)
       (*(long *)(lVar3 + 0x30) +
       (long)(*(int *)((long)pvVar8 + 0x24) * *(int *)(lVar3 + 8) + iVar11) * 8) =
           *(undefined8 *)((long)pvVar5 + lVar1);
      pAVar10 = p->pAig;
    }
    if (pAVar10->nRegs != (int)lVar9) {
      __assert_fail("k == Aig_ManRegNum(p->pAig)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/fra/fraBmc.c"
                    ,0x117,"Aig_Man_t *Fra_BmcFrames(Fra_Bmc_t *, int)");
    }
  }
  free(pvVar5);
  if (fKeepPos == 0) {
    for (iVar11 = 0; iVar11 < p_00->vObjs->nSize; iVar11 = iVar11 + 1) {
      pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(p_00->vObjs,iVar11);
      if (((pAVar6 != (Aig_Obj_t *)0x0) && ((*(ulong *)&pAVar6->field_0x18 & 0xffffffc0) == 0)) &&
         (((uint)*(ulong *)&pAVar6->field_0x18 & 7) - 5 < 2)) {
        Aig_ObjCreateCo(p_00,pAVar6);
      }
    }
  }
  else {
    for (iVar11 = 0; iVar11 < iVar14; iVar11 = iVar11 + 1) {
      for (iVar14 = 0; iVar14 < pAVar10->nObjs[3] - pAVar10->nRegs; iVar14 = iVar14 + 1) {
        pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(pAVar10->vCos,iVar14);
        pAVar6 = Bmc_ObjChild0Frames(pAVar6,iVar11);
        Aig_ObjCreateCo(p_00,pAVar6);
        pAVar10 = p->pAig;
      }
      iVar14 = p->nFramesAll;
    }
    Aig_ManCleanup(p_00);
  }
  return p_00;
}

Assistant:

Aig_Man_t * Fra_BmcFrames( Fra_Bmc_t * p, int fKeepPos )
{
    Aig_Man_t * pAigFrames;
    Aig_Obj_t * pObj, * pObjNew;
    Aig_Obj_t ** pLatches;
    int i, k, f;

    // start the fraig package
    pAigFrames = Aig_ManStart( Aig_ManObjNumMax(p->pAig) * p->nFramesAll );
    pAigFrames->pName = Abc_UtilStrsav( p->pAig->pName );
    pAigFrames->pSpec = Abc_UtilStrsav( p->pAig->pSpec );
    // create PI nodes for the frames
    for ( f = 0; f < p->nFramesAll; f++ )
        Bmc_ObjSetFrames( Aig_ManConst1(p->pAig), f, Aig_ManConst1(pAigFrames) );
    for ( f = 0; f < p->nFramesAll; f++ )
        Aig_ManForEachPiSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f, Aig_ObjCreateCi(pAigFrames) );
    // set initial state for the latches
    Aig_ManForEachLoSeq( p->pAig, pObj, i )
        Bmc_ObjSetFrames( pObj, 0, Aig_ManConst0(pAigFrames) );

    // add timeframes
    pLatches = ABC_ALLOC( Aig_Obj_t *, Aig_ManRegNum(p->pAig) );
    for ( f = 0; f < p->nFramesAll; f++ )
    {
        // add internal nodes of this frame
        Aig_ManForEachNode( p->pAig, pObj, i )
        {
            pObjNew = Aig_And( pAigFrames, Bmc_ObjChild0Frames(pObj,f), Bmc_ObjChild1Frames(pObj,f) );
            Bmc_ObjSetFrames( pObj, f, pObjNew );
        }
        if ( f == p->nFramesAll - 1 )
            break;
        // save the latch input values
        k = 0;
        Aig_ManForEachLiSeq( p->pAig, pObj, i )
            pLatches[k++] = Bmc_ObjChild0Frames(pObj,f);
        assert( k == Aig_ManRegNum(p->pAig) );
        // insert them to the latch output values
        k = 0;
        Aig_ManForEachLoSeq( p->pAig, pObj, i )
            Bmc_ObjSetFrames( pObj, f+1, pLatches[k++] );
        assert( k == Aig_ManRegNum(p->pAig) );
    }
    ABC_FREE( pLatches );
    if ( fKeepPos )
    {
        for ( f = 0; f < p->nFramesAll; f++ )
            Aig_ManForEachPoSeq( p->pAig, pObj, i )
                Aig_ObjCreateCo( pAigFrames, Bmc_ObjChild0Frames(pObj,f) );
        Aig_ManCleanup( pAigFrames );
    }
    else
    {
        // add POs to all the dangling nodes
        Aig_ManForEachObj( pAigFrames, pObjNew, i )
            if ( Aig_ObjIsNode(pObjNew) && pObjNew->nRefs == 0 )
                Aig_ObjCreateCo( pAigFrames, pObjNew );
    }
    // return the new manager
    return pAigFrames;
}